

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O1

bool trng::operator==(status_type *a,status_type *b)

{
  result_type_conflict *prVar1;
  result_type_conflict *prVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  if (a->index != b->index) {
    return false;
  }
  uVar3 = int_math::ceil2<unsigned_int>(0x209);
  bVar5 = uVar3 == 0;
  if ((!bVar5) && (a->r[0] == b->r[0])) {
    lVar4 = 1;
    do {
      uVar3 = int_math::ceil2<unsigned_int>(0x209);
      bVar5 = uVar3 <= (uint)lVar4;
      if (bVar5) {
        return bVar5;
      }
      prVar1 = a->r + lVar4;
      prVar2 = b->r + lVar4;
      lVar4 = lVar4 + 1;
    } while (*prVar1 == *prVar2);
  }
  return bVar5;
}

Assistant:

bool operator==(const status_type &a, const status_type &b) {
        if (a.index != b.index)
          return false;
        for (unsigned int i{0}; i < a.size(); ++i)
          if (a.r[i] != b.r[i])
            return false;
        return true;
      }